

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3FixSelect(DbFixer *pFix,Select *pSelect)

{
  int iVar1;
  Select *local_20;
  Select *pSelect_local;
  DbFixer *pFix_local;
  
  local_20 = pSelect;
  while( true ) {
    if (local_20 == (Select *)0x0) {
      return 0;
    }
    iVar1 = sqlite3FixExprList(pFix,local_20->pEList);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = sqlite3FixSrcList(pFix,local_20->pSrc);
    if (iVar1 != 0) {
      return 1;
    }
    iVar1 = sqlite3FixExpr(pFix,local_20->pWhere);
    if (iVar1 != 0) break;
    iVar1 = sqlite3FixExpr(pFix,local_20->pHaving);
    if (iVar1 != 0) {
      return 1;
    }
    local_20 = local_20->pPrior;
  }
  return 1;
}

Assistant:

SQLITE_PRIVATE int sqlite3FixSelect(
  DbFixer *pFix,       /* Context of the fixation */
  Select *pSelect      /* The SELECT statement to be fixed to one database */
){
  while( pSelect ){
    if( sqlite3FixExprList(pFix, pSelect->pEList) ){
      return 1;
    }
    if( sqlite3FixSrcList(pFix, pSelect->pSrc) ){
      return 1;
    }
    if( sqlite3FixExpr(pFix, pSelect->pWhere) ){
      return 1;
    }
    if( sqlite3FixExpr(pFix, pSelect->pHaving) ){
      return 1;
    }
    pSelect = pSelect->pPrior;
  }
  return 0;
}